

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

char * CreateLlvmName(LlvmCompilationContext *ctx,InplaceStr str)

{
  Allocator *pAVar1;
  LlvmCompilationContext *__src;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  char *name;
  LlvmCompilationContext *ctx_local;
  InplaceStr str_local;
  char *__dest;
  
  str_local.begin = str.end;
  ctx_local = (LlvmCompilationContext *)str.begin;
  pAVar1 = ctx->allocator;
  uVar2 = InplaceStr::length((InplaceStr *)&ctx_local);
  iVar3 = (*pAVar1->_vptr_Allocator[2])(pAVar1,(ulong)(uVar2 + 1));
  __src = ctx_local;
  __dest = (char *)CONCAT44(extraout_var,iVar3);
  uVar2 = InplaceStr::length((InplaceStr *)&ctx_local);
  memcpy(__dest,__src,(ulong)uVar2);
  uVar2 = InplaceStr::length((InplaceStr *)&ctx_local);
  __dest[uVar2] = '\0';
  return __dest;
}

Assistant:

char* CreateLlvmName(LlvmCompilationContext &ctx, InplaceStr str)
{
	char *name = (char*)ctx.allocator->alloc(str.length() + 1);

	memcpy(name, str.begin, str.length());
	name[str.length()] = 0;

	return name;
}